

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O0

void __thiscall license::test::issue_license_help::test_method(issue_license_help *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  streambuf *new_buffer;
  long lVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_258;
  assertion_result local_238;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  undefined1 local_200 [8];
  string stdout_str;
  int result;
  cout_redirect local_1d0;
  cout_redirect guard;
  output_test_stream local_1b8 [8];
  output_test_stream output;
  char *pcStack_38;
  char *argv1 [4];
  int argc;
  issue_license_help *this_local;
  
  argv1[3]._4_4_ = 4;
  argv1[1] = "issue";
  argv1[2] = "-h";
  pcStack_38 = "lcc";
  argv1[0] = "license";
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)&guard);
  boost::test_tools::output_test_stream::output_test_stream
            (local_1b8,(basic_cstring<const_char> *)&guard,1);
  new_buffer = (streambuf *)std::__cxx11::ostringstream::rdbuf();
  cout_redirect::cout_redirect(&local_1d0,new_buffer);
  stdout_str.field_2._8_4_ = CommandLineParser::parseCommandLine(argv1[3]._4_4_,&pcStack_38);
  cout_redirect::~cout_redirect(&local_1d0);
  std::__cxx11::ostringstream::str();
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
               ,0x79);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_210,0x89,&local_220);
    lVar3 = std::__cxx11::string::find(local_200,0x4c62b6);
    boost::test_tools::assertion_result::assertion_result(&local_238,lVar3 != -1);
    prev = boost::unit_test::lazy_ostream::instance();
    std::operator+(&local_278,"command help was print out ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    boost::unit_test::operator<<(&local_258,prev,&local_278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
               ,0x79);
    boost::test_tools::tt_detail::report_assertion(&local_238,&local_258,&local_288,0x89,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    boost::test_tools::assertion_result::~assertion_result(&local_238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_200);
  boost::test_tools::output_test_stream::~output_test_stream(local_1b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(issue_license_help) {
	int argc = 4;
	const char* argv1[] = {"lcc", "license", "issue", "-h"};
	// initialize_project
	boost::test_tools::output_test_stream output;
	{
		cout_redirect guard(output.rdbuf());
		int result = CommandLineParser::parseCommandLine(argc, argv1);
	}
	string stdout_str = output.str();
	BOOST_CHECK_MESSAGE(stdout_str.find(PARAM_CLIENT_SIGNATURE) != string::npos,
						"command help was print out " + stdout_str);
}